

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O2

void __thiscall
InterpreterTest_LtSI64_Test::InterpreterTest_LtSI64_Test(InterpreterTest_LtSI64_Test *this)

{
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__Test_002b95a8;
  return;
}

Assistant:

TEST(InterpreterTest, LtSI64) {
  Module wasm;
  IRBuilder builder(wasm);

  ASSERT_FALSE(builder.makeConst(Literal(int64_t(-1))).getErr());
  ASSERT_FALSE(builder.makeConst(Literal(int64_t(-2))).getErr());
  ASSERT_FALSE(builder.makeBinary(LtSInt64).getErr());

  auto expr = builder.build();
  ASSERT_FALSE(expr.getErr());

  auto results = Interpreter{}.runTest(*expr);
  std::vector<Literal> expected{Literal(int32_t(0))};

  EXPECT_EQ(results, expected);
}